

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

function_record *
pybind11::class_<anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::get_function_record(handle h)

{
  handle hVar1;
  function_record *pfVar2;
  handle local_10;
  
  hVar1 = detail::get_function(h);
  if (hVar1.m_ptr == (PyObject *)0x0) {
    pfVar2 = (function_record *)0x0;
  }
  else {
    if ((*(byte *)(hVar1.m_ptr[1].ob_refcnt + 0x10) & 0x20) == 0) {
      local_10.m_ptr = (PyObject *)hVar1.m_ptr[1].ob_type;
      if ((PyTypeObject *)local_10.m_ptr != (PyTypeObject *)0x0) {
        (((PyTypeObject *)local_10.m_ptr)->ob_base).ob_base.ob_refcnt =
             (((PyTypeObject *)local_10.m_ptr)->ob_base).ob_base.ob_refcnt + 1;
      }
    }
    else {
      local_10.m_ptr = (PyObject *)0x0;
    }
    pfVar2 = capsule::operator_cast_to_function_record_((capsule *)&local_10);
    pybind11::object::~object((object *)&local_10);
  }
  return pfVar2;
}

Assistant:

static detail::function_record *get_function_record(handle h) {
        h = detail::get_function(h);
        return h ? (detail::function_record *) reinterpret_borrow<capsule>(PyCFunction_GET_SELF(h.ptr()))
                 : nullptr;
    }